

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

shared_ptr<mocker::ir::Addr> __thiscall
mocker::ir::Builder::translateNewArray
          (Builder *this,shared_ptr<mocker::ast::Type> *rawCurType,
          queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
          *sizeProvided)

{
  _Map_pointer ppsVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Elt_pointer psVar2;
  string *psVar3;
  BuilderContext *pBVar4;
  _Elt_pointer psVar5;
  _List_node_base *p_Var6;
  undefined8 uVar7;
  bool bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar9;
  BBLIter BVar10;
  BBLIter iter;
  BBLIter iter_00;
  deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  shared_ptr<mocker::ir::Addr> sVar12;
  undefined1 auVar13 [16];
  shared_ptr<mocker::ast::Type> elementType;
  shared_ptr<mocker::ir::Reg> memPtr;
  shared_ptr<mocker::ir::Reg> curElementPtrPtr;
  shared_ptr<mocker::ir::Jump> jump2condition;
  shared_ptr<mocker::ir::Reg> curElementPtr;
  shared_ptr<mocker::ir::Reg> contentEndPtr;
  shared_ptr<mocker::ir::Reg> contentLen;
  value_type size;
  shared_ptr<mocker::ir::Reg> nextElementPtr;
  shared_ptr<mocker::ir::Addr> elementInstPtr;
  shared_ptr<mocker::ir::Reg> cmpRes;
  shared_ptr<mocker::ir::Label> successorLabel;
  shared_ptr<mocker::ir::Label> bodyLabel;
  shared_ptr<mocker::ir::Label> conditionLabel;
  shared_ptr<mocker::ir::Reg> memLen;
  shared_ptr<mocker::ir::Addr> local_1c8;
  element_type local_1b8 [3];
  BBLIter local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [24];
  undefined1 local_170 [16];
  undefined1 local_160 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  OpType local_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  __node_base local_f0;
  shared_ptr<mocker::ir::IRInst> local_e8;
  undefined1 local_d8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  shared_ptr<mocker::ir::Label> local_98;
  shared_ptr<mocker::ir::Label> local_88;
  shared_ptr<mocker::ir::Label> local_78;
  undefined1 local_68 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  ppsVar1 = (sizeProvided->c).
            super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Deque_impl_data._M_map;
  if (ppsVar1 == (_Map_pointer)0x0) {
LAB_0013ee10:
    __assert_fail("curType",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                  ,0x2d1,
                  "std::shared_ptr<Addr> mocker::ir::Builder::translateNewArray(const std::shared_ptr<ast::Type> &, std::queue<std::shared_ptr<Addr>> &) const"
                 );
  }
  local_1a0._M_node =
       (_List_node_base *)
       (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi[0x29]._vptr__Sp_counted_base;
  lVar9 = __dynamic_cast(ppsVar1,&ast::Type::typeinfo,&ast::ArrayType::typeinfo,0);
  if (lVar9 == 0) goto LAB_0013ee10;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (sizeProvided->c).
            super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_198._0_8_ = *(long *)(lVar9 + 0x18);
  local_198._8_8_ = *(long *)(lVar9 + 0x20);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count + 1;
    }
  }
  psVar2 = (in_RCX->
           super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_108._16_8_ =
       (psVar2->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f0._M_nxt =
       (_Hash_node_base *)
       (psVar2->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_nxt)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_nxt)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_nxt)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_nxt)->_M_use_count + 1;
    }
  }
  std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  ::pop_front(in_RCX);
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"memLen","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_68,psVar3);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1b8
     ) {
    operator_delete(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1b8[0]._vptr_Addr + 1);
  }
  BuilderContext::emplaceInst<mocker::ir::AttachedComment,char_const(&)[28]>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(char (*) [28])"Calculate the memory needed");
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"contentLen","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_108,psVar3);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1b8
     ) {
    operator_delete(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1b8[0]._vptr_Addr + 1);
  }
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_170._0_4_ = Mul;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e9db0;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 8;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>&>
            (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_108,(OpType *)local_170,&local_1c8,
             (shared_ptr<mocker::ir::Addr> *)(local_108 + 0x10));
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_170._0_4_ = Add;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e9db0;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 8;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
            (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_68,(OpType *)local_170,
             (shared_ptr<mocker::ir::Reg> *)local_108,&local_1c8);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"memPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_170,psVar3);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1b8
     ) {
    operator_delete(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1b8[0]._vptr_Addr + 1);
  }
  BuilderContext::
  emplaceInst<mocker::ir::Malloc,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_170,
             (shared_ptr<mocker::ir::Reg> *)local_68);
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"arrayInstPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_188,psVar3);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1b8
     ) {
    operator_delete(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1b8[0]._vptr_Addr + 1);
  }
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_160._0_4_ = Add;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e9db0;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 8;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
            (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_188,(OpType *)local_160,
             (shared_ptr<mocker::ir::Reg> *)local_170,&local_1c8);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BuilderContext::
  emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_170,
             (shared_ptr<mocker::ir::Addr> *)(local_108 + 0x10));
  bVar8 = isIntTy((Builder *)rawCurType,(shared_ptr<mocker::ast::Type> *)local_198);
  _Var11._M_pi = extraout_RDX;
  if ((bVar8) ||
     (bVar8 = isBoolTy((Builder *)rawCurType,(shared_ptr<mocker::ast::Type> *)local_198),
     _Var11._M_pi = extraout_RDX_00, bVar8)) goto LAB_0013e5ca;
  local_138._24_8_ = this;
  if ((element_type *)local_198._0_8_ != (element_type *)0x0) {
    auVar13 = __dynamic_cast(local_198._0_8_,&ast::Type::typeinfo,&ast::ArrayType::typeinfo,0);
    _Var11._M_pi = auVar13._8_8_;
    if (auVar13._0_8_ != 0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if ((in_RCX->
            super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            )._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            (in_RCX->
            super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0013e6c1;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
        }
        psVar2 = (in_RCX->
                 super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 )._M_impl.super__Deque_impl_data._M_finish._M_cur;
        psVar5 = (in_RCX->
                 super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        _Var11._M_pi = extraout_RDX_07;
        this = (Builder *)local_138._24_8_;
        if (psVar2 != psVar5) goto LAB_0013e6c1;
      }
LAB_0013e5ca:
      *(undefined8 *)this = local_188._0_8_;
      this->ctx = (BuilderContext *)local_188._8_8_;
      goto LAB_0013e5d3;
    }
  }
LAB_0013e6c1:
  BuilderContext::emplaceInst<mocker::ir::Comment,char_const(&)[26]>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(char (*) [26])"init the content of array");
  local_138._16_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._16_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._16_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._16_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_base_001ea308;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._16_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)rawCurType;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._16_8_ + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._16_8_ + 0x10))->_M_weak_count = 0;
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"curElementPtrPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_160,psVar3);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1b8
     ) {
    operator_delete(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1b8[0]._vptr_Addr + 1);
  }
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  BVar10._M_node =
       (((BasicBlockList *)((long)local_1a0._M_node + 0x38))->
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>)._M_impl.
       _M_node.super__List_node_base._M_next;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
            (&local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(Alloca **)&local_1c8,(allocator<mocker::ir::Alloca> *)local_118,
             (shared_ptr<mocker::ir::Reg> *)local_160);
  local_68._32_8_ =
       local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_40 = local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BuilderContext::appendInstFront(pBVar4,BVar10,(shared_ptr<mocker::ir::IRInst> *)(local_68 + 0x20))
  ;
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BuilderContext::
  emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_160,
             (shared_ptr<mocker::ir::Reg> *)local_188);
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"contentEndPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_118,psVar3);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1b8
     ) {
    operator_delete(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1b8[0]._vptr_Addr + 1);
  }
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _4_4_,5);
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_118,(OpType *)&local_1c8,
             (shared_ptr<mocker::ir::Reg> *)local_188,(shared_ptr<mocker::ir::Reg> *)local_108);
  BVar10 = BuilderContext::getCurBasicBlock
                     ((BuilderContext *)
                      (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi);
  iter = FunctionModule::insertBBAfter(local_1a0._M_node,BVar10);
  p_Var6 = iter._M_node[1]._M_next;
  local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
  local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
  *(_List_node_base **)
   &local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = p_Var6;
  iter_00 = FunctionModule::insertBBAfter(local_1a0._M_node,iter);
  p_Var6 = iter_00._M_node[1]._M_next;
  local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  BVar10._M_node = local_1a0._M_node;
  (local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
  local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
  *(_List_node_base **)
   &local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = p_Var6;
  local_1a0 = iter_00;
  local_68._16_8_ = FunctionModule::insertBBAfter((FunctionModule *)BVar10._M_node,iter_00);
  p_Var6 = ((_List_node_base *)(local_68._16_8_ + 0x10))->_M_next;
  local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
  local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
  *(_List_node_base **)
   &local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = p_Var6;
  local_160._16_8_ = (_List_node_base *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Jump,std::allocator<mocker::ir::Jump>,std::shared_ptr<mocker::ir::Label>&>
            (&local_148,(Jump **)(local_160 + 0x10),(allocator<mocker::ir::Jump> *)&local_1c8,
             &local_78);
  this = (Builder *)local_138._24_8_;
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_b8._16_8_ = local_160._16_8_;
  local_a0 = local_148._M_pi;
  if (local_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
    }
  }
  BuilderContext::appendInst(pBVar4,(shared_ptr<mocker::ir::IRInst> *)(local_b8 + 0x10));
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  BuilderContext::setCurBasicBlock
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,iter);
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"curElementPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_138,psVar3);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1b8
     ) {
    operator_delete(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1b8[0]._vptr_Addr + 1);
  }
  BuilderContext::
  emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_138,
             (shared_ptr<mocker::ir::Reg> *)local_160);
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"cmpRes","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_b8,psVar3);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1b8
     ) {
    operator_delete(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1b8[0]._vptr_Addr + 1);
  }
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _4_4_,1);
  BuilderContext::
  emplaceInst<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::RelationInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_b8,(OpType *)&local_1c8,
             (shared_ptr<mocker::ir::Reg> *)local_138,(shared_ptr<mocker::ir::Reg> *)local_118);
  BuilderContext::
  emplaceInst<mocker::ir::Branch,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Label>&,std::shared_ptr<mocker::ir::Label>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_b8,&local_88,&local_98);
  BuilderContext::setCurBasicBlock
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,local_1a0);
  if (((element_type *)local_198._0_8_ == (element_type *)0x0) ||
     (lVar9 = __dynamic_cast(local_198._0_8_,&ast::Type::typeinfo,&ast::ArrayType::typeinfo,0),
     uVar7 = local_198._8_8_, lVar9 == 0)) {
    makeNewNonarray((Builder *)(local_d8 + 0x10),rawCurType);
  }
  else {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
      }
    }
    translateNewArray((Builder *)(local_d8 + 0x10),rawCurType,
                      (queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                       *)local_198);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
    }
  }
  BuilderContext::
  emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_138,
             (shared_ptr<mocker::ir::Addr> *)(local_d8 + 0x10));
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"nextElementPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_d8,psVar3);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1b8
     ) {
    operator_delete(local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1b8[0]._vptr_Addr + 1);
  }
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_13c = Add;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e9db0;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 8;
  local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
            (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_d8,&local_13c,
             (shared_ptr<mocker::ir::Reg> *)local_138,&local_1c8);
  if (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BuilderContext::
  emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_160,
             (shared_ptr<mocker::ir::Reg> *)local_d8);
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_160._16_8_;
  local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_148._M_pi;
  if (local_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
    }
  }
  BuilderContext::appendInst(pBVar4,&local_e8);
  if (local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BuilderContext::setCurBasicBlock
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(BBLIter)local_68._16_8_);
  uVar7 = local_188._8_8_;
  local_188._8_8_ = (BuilderContext *)0x0;
  *(undefined8 *)this = local_188._0_8_;
  *(undefined8 *)((long)this + 8) = uVar7;
  local_188._0_8_ = (element_type *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
  }
  if (local_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148._M_pi);
  }
  if (local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._16_8_);
  _Var11._M_pi = extraout_RDX_08;
  if ((BuilderContext *)local_188._8_8_ != (BuilderContext *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
    _Var11._M_pi = extraout_RDX_09;
  }
LAB_0013e5d3:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
    _Var11._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
    _Var11._M_pi = extraout_RDX_02;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    _Var11._M_pi = extraout_RDX_03;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_nxt);
    _Var11._M_pi = extraout_RDX_04;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
    _Var11._M_pi = extraout_RDX_05;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var11._M_pi = extraout_RDX_06;
  }
  sVar12.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  sVar12.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Addr>)
         sVar12.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr> Builder::translateNewArray(
    const std::shared_ptr<ast::Type> &rawCurType,
    std::queue<std::shared_ptr<Addr>> &sizeProvided) const {
  // We describe the translation of statements "new T[N]" here. First, note that
  // the result is a pointer arrayInstPtr, which points to the address of the
  // first element of the array. (The length of the array is store in front of
  // the array elements.) It is the return value of this function. Hence, the
  // first step is
  //   1. to malloc a piece of memory of length 8 + 8 * N and store the address
  //      + 8 into arrayInstPtr;
  //   2. and store N into the first 8 bytes.
  // Then, we shall construct the array. If T is int or bool, then there is
  // nothing to do. Otherwise, we shall construct each element via a loop. To
  // implement the loop, we first need aa temporary variable to store the
  // address of the current element since our registers are of SSA form, that
  // is, they can not be assigned more than once. Namely, we shall
  //   3. alloca a piece of memory for the temporary varaible and store the
  //      address into the register curElementPtrPtr. And store the address of
  //      the head, namely, the contentPtr, into the address stored in
  //      curElementPtrPtr. (Meanwhile, we shall compute the address of the
  //      end of the array for later use.)
  // After finishing the routine of creating basic blocks and labels, we
  // construct the condition for the loop to end.
  //   4. Load curElementPtr from the address stored in curElementPtrPtr.
  //   5. Compare it with the end pointer and jump according to the result.
  // Now we implement the body of the loop. In fact, what we need to do is just
  // initializing the current element.
  //   6. New an element. (See next section for details.)
  //   7. Store the address into the current element.
  //   8. Update the loop variable and jump back to the condition basic block.
  //
  // In this passage, we handle some details. First, we need to support newing
  // a jagged array. To achieve this, we let this function to be recursive, that
  // is, in step 6., if the type of the element is still array, then, instead of
  // newing an element, we call this function recursively and pass down the
  // remaining provided sizes.
  // Note that the number of sizes provided may be less than the dimension of
  // the array. This case is similar to the int/bool case. We just return after
  // step 2., leaving the elements uninitialized.

  auto &func = ctx.getCurFunc();
  auto curType = std::dynamic_pointer_cast<ast::ArrayType>(rawCurType);
  assert(curType);
  auto elementType = curType->baseType;

  // 1.
  auto size = sizeProvided.front();
  sizeProvided.pop();
  auto memLen = ctx.makeTempLocalReg("memLen");
  ctx.emplaceInst<AttachedComment>("Calculate the memory needed");
  auto contentLen = ctx.makeTempLocalReg("contentLen");
  ctx.emplaceInst<ArithBinaryInst>(contentLen, ArithBinaryInst::Mul,
                                   makeILit(8),
                                   size); // calcMemLen
  ctx.emplaceInst<ArithBinaryInst>(memLen, ArithBinaryInst::Add, contentLen,
                                   makeILit(8));
  auto memPtr = ctx.makeTempLocalReg("memPtr");
  ctx.emplaceInst<Malloc>(memPtr, memLen);

  auto arrayInstPtr = ctx.makeTempLocalReg("arrayInstPtr");
  ctx.emplaceInst<ArithBinaryInst>(arrayInstPtr, ArithBinaryInst::Add, memPtr,
                                   makeILit(8));

  // 2.
  ctx.emplaceInst<Store>(memPtr, size);

  // 3.
  if (isIntTy(elementType) || isBoolTy(elementType))
    return arrayInstPtr;
  if ((bool)std::dynamic_pointer_cast<ast::ArrayType>(elementType) &&
      sizeProvided.empty())
    return arrayInstPtr;

  ctx.emplaceInst<Comment>("init the content of array");
  auto defer = std::shared_ptr<void *>(
      nullptr, [this](void *) { ctx.emplaceInst<Comment>(""); });

  auto curElementPtrPtr = ctx.makeTempLocalReg("curElementPtrPtr");
  ctx.appendInstFront(func.getFirstBB(),
                      std::make_shared<Alloca>(curElementPtrPtr));
  ctx.emplaceInst<Store>(curElementPtrPtr, arrayInstPtr);
  auto contentEndPtr = ctx.makeTempLocalReg("contentEndPtr");
  // calcContentEndPtr
  ctx.emplaceInst<ArithBinaryInst>(contentEndPtr, ArithBinaryInst::Add,
                                   arrayInstPtr, contentLen);

  auto originBB = ctx.getCurBasicBlock();
  auto conditionFirstBB = func.insertBBAfter(originBB);
  auto conditionLabel = getBBLabel(conditionFirstBB);
  auto bodyFirstBB = func.insertBBAfter(conditionFirstBB);
  auto bodyLabel = getBBLabel(bodyFirstBB);
  auto successorBB = func.insertBBAfter(bodyFirstBB);
  auto successorLabel = getBBLabel(successorBB);

  auto jump2condition = std::make_shared<Jump>(conditionLabel);
  ctx.appendInst(jump2condition);

  // 4.
  ctx.setCurBasicBlock(conditionFirstBB);
  auto curElementPtr = ctx.makeTempLocalReg("curElementPtr");
  ctx.emplaceInst<Load>(curElementPtr, curElementPtrPtr);
  // 5.
  auto cmpRes = ctx.makeTempLocalReg("cmpRes");
  ctx.emplaceInst<RelationInst>(cmpRes, RelationInst::Ne, curElementPtr,
                                contentEndPtr);
  ctx.emplaceInst<Branch>(cmpRes, bodyLabel, successorLabel);

  // 6.
  ctx.setCurBasicBlock(bodyFirstBB);
  auto elementInstPtr =
      (bool)std::dynamic_pointer_cast<ast::ArrayType>(elementType)
          ? translateNewArray(elementType, sizeProvided)
          : makeNewNonarray(elementType);
  // 7.
  ctx.emplaceInst<Store>(curElementPtr, elementInstPtr);
  // 8.
  auto nextElementPtr = ctx.makeTempLocalReg("nextElementPtr");
  ctx.emplaceInst<ArithBinaryInst>(nextElementPtr, ArithBinaryInst::Add,
                                   curElementPtr,
                                   makeILit(8)); // calcNextElementPtr
  ctx.emplaceInst<Store>(curElementPtrPtr, nextElementPtr);
  ctx.appendInst(jump2condition);

  ctx.setCurBasicBlock(successorBB);
  return arrayInstPtr;
}